

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

void preprocess_upvalues(Proc *proc)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  Proc *proc_00;
  uint uVar6;
  PtrListIterator child_prociter__;
  PtrListIterator local_50;
  PtrListIterator local_38;
  
  raviX_ptrlist_forward_iterator
            (&local_38,(PtrList *)(proc->function_expr->field_2).function_expr.upvalues);
  pvVar3 = raviX_ptrlist_iter_next(&local_38);
  if (pvVar3 != (void *)0x0) {
    do {
      piVar1 = *(int **)((long)pvVar3 + 0x18);
      if (*piVar1 == 0) {
        lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x20) + 0x20);
        if (lVar4 != **(long **)(piVar1 + 8)) {
          if (lVar4 == 0) goto LAB_0011df52;
          goto LAB_0011de8d;
        }
        uVar6 = 0x10000;
        uVar2 = **(uint **)(piVar1 + 0xe) >> 4;
      }
      else {
        lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x20) + 0x20);
        if (lVar4 == 0) {
          if (*piVar1 != 4) {
LAB_0011df52:
            __assert_fail("underlying->symbol_type == SYM_ENV",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                          ,0xde6,"unsigned int get_upvalue_idx(Proc *, LuaSymbol *, _Bool *)");
          }
          uVar2 = 0;
          uVar6 = 0x10000;
        }
        else {
LAB_0011de8d:
          raviX_ptrlist_forward_iterator(&local_50,*(PtrList **)(lVar4 + 0x48));
          do {
            pvVar5 = raviX_ptrlist_iter_next(&local_50);
            if (pvVar5 == (void *)0x0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                            ,0xdf2,"unsigned int get_upvalue_idx(Proc *, LuaSymbol *, _Bool *)");
            }
          } while (*(long *)((long)pvVar5 + 0x18) != *(long *)((long)pvVar3 + 0x18));
          uVar2 = *(uint *)((long)pvVar5 + 0x28);
          uVar6 = 0;
        }
      }
      *(uint *)((long)pvVar3 + 0x28) = uVar2 << 0x11 | *(ushort *)((long)pvVar3 + 0x28) | uVar6;
      pvVar3 = raviX_ptrlist_iter_next(&local_38);
    } while (pvVar3 != (void *)0x0);
  }
  raviX_ptrlist_forward_iterator(&local_50,(PtrList *)proc->procs);
  proc_00 = (Proc *)raviX_ptrlist_iter_next(&local_50);
  if (proc_00 != (Proc *)0x0) {
    do {
      preprocess_upvalues(proc_00);
      proc_00 = (Proc *)raviX_ptrlist_iter_next(&local_50);
    } while (proc_00 != (Proc *)0x0);
  }
  return;
}

Assistant:

static void preprocess_upvalues(Proc *proc)
{
	compute_upvalue_attributes(proc);
	Proc *child_proc;
	FOR_EACH_PTR(proc->procs, Proc, child_proc) { preprocess_upvalues(child_proc); }
	END_FOR_EACH_PTR(childproc)
}